

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::showButtonsInMenuBar(QMdiSubWindowPrivate *this,QMenuBar *menuBar)

{
  QWidget *this_00;
  Data *pDVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  ControlContainer *this_01;
  QWidget *this_02;
  QLayout *pQVar4;
  int iVar5;
  QObject *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar3 = isChildOfTabbedQMdiArea((QMdiSubWindow *)this_00);
  if (bVar3) goto LAB_00419333;
  removeButtonsFromMenuBar(this);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->controlContainer);
  if (!bVar3) {
    this_01 = (ControlContainer *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(this_01,(QMdiSubWindow *)this_00);
    QWeakPointer<QObject>::assign<QObject>(&(this->controlContainer).wp,(QObject *)this_01);
  }
  this->ignoreWindowTitleChange = true;
  QMdi::ControlContainer::showButtonsInMenuBar
            ((ControlContainer *)(this->controlContainer).wp.value,menuBar);
  this->ignoreWindowTitleChange = false;
  this_02 = QWidget::window(this_00);
  bVar3 = QWidget::isWindowModified(this_00);
  QWidget::setWindowModified(this_02,bVar3);
  QObject::installEventFilter(&this_02->super_QObject);
  pDVar1 = (this->controlContainer).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar6 = (QObject *)0x0;
  }
  else {
    pQVar6 = (this->controlContainer).wp.value;
  }
  if (((*(long *)(pQVar6 + 0x40) == 0) || (*(int *)(*(long *)(pQVar6 + 0x40) + 4) == 0)) ||
     (*(long *)(pQVar6 + 0x48) == 0)) {
    iVar5 = 0;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = (this->controlContainer).wp.value;
    }
    if (((*(long *)(pQVar6 + 0x50) != 0) && (*(int *)(*(long *)(pQVar6 + 0x50) + 4) != 0)) &&
       (*(long *)(pQVar6 + 0x58) != 0)) {
      lVar7 = 0x58;
      goto LAB_004192c4;
    }
  }
  else {
    lVar7 = 0x48;
LAB_004192c4:
    lVar7 = *(long *)(*(long *)((this->controlContainer).wp.value + lVar7) + 0x20);
    iVar5 = (*(int *)(lVar7 + 0x20) - *(int *)(lVar7 + 0x18)) + 1;
  }
  if ((menuBar != (QMenuBar *)0x0) &&
     (pQVar2 = (menuBar->super_QWidget).data,
     ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1 < iVar5)) {
    pQVar4 = QWidget::layout(this_02);
    if (pQVar4 != (QLayout *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_48,LayoutRequest);
      QCoreApplication::sendEvent(&this_02->super_QObject,(QEvent *)&local_48);
      QEvent::~QEvent((QEvent *)&local_48);
    }
  }
LAB_00419333:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::showButtonsInMenuBar(QMenuBar *menuBar)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(q->isMaximized() && !drawTitleBarWhenMaximized());

    if (isChildOfTabbedQMdiArea(q))
        return;

    removeButtonsFromMenuBar();
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    ignoreWindowTitleChange = true;
    controlContainer->showButtonsInMenuBar(menuBar);
    ignoreWindowTitleChange = false;

    QWidget *topLevelWindow = q->window();
    topLevelWindow->setWindowModified(q->isWindowModified());
    topLevelWindow->installEventFilter(q);

    int buttonHeight = 0;
    if (controlContainer->controllerWidget())
        buttonHeight = controlContainer->controllerWidget()->height();
    else if (controlContainer->systemMenuLabel())
        buttonHeight = controlContainer->systemMenuLabel()->height();

    // This will rarely happen.
    if (menuBar && menuBar->height() < buttonHeight
            && topLevelWindow->layout()) {
        // Make sure topLevelWindow->contentsRect returns correct geometry.
        // topLevelWidget->updateGeoemtry will not do the trick here since it will post the event.
        QEvent event(QEvent::LayoutRequest);
        QCoreApplication::sendEvent(topLevelWindow, &event);
    }
}